

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

bool __thiscall optimization::common_expr_del::Node::operator<(Node *this,Node *other)

{
  __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last;
  __normal_iterator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  Op *pOVar5;
  ExtraNormOp *pEVar6;
  InNormOp *pIVar7;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar8;
  int __c_03;
  int extraout_EDX_02;
  char *in_RSI;
  long in_RDI;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reverse_operands;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar9;
  undefined4 in_stack_ffffffffffffff80;
  InNormOp IVar10;
  InNormOp in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  ExtraNormOp EVar11;
  ExtraNormOp in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  Op OVar12;
  Op in_stack_ffffffffffffff94;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0xf8) & 1) == (in_RSI[0xf8] & 1U)) {
    pcVar4 = in_RSI;
    pcVar2 = std::
             variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
             ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                      *)(in_RDI + 0x18),in_RSI,in_EDX);
    pcVar3 = std::
             variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
             ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                      *)(in_RSI + 0x18),pcVar4,__c);
    if (pcVar2 == pcVar3) {
      pcVar2 = std::
               variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
               ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                        *)(in_RDI + 0x18),pcVar4,__c_00);
      if (pcVar2 == (char *)0x0) {
        pOVar5 = std::
                 get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             *)0x171311);
        in_stack_ffffffffffffff94 = *pOVar5;
        pOVar5 = std::
                 get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             *)0x171328);
        iVar8 = extraout_EDX;
        if (in_stack_ffffffffffffff94 != *pOVar5) {
          pOVar5 = std::
                   get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x171341);
          OVar12 = *pOVar5;
          pOVar5 = std::
                   get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x171358);
          local_1 = (int)OVar12 < (int)*pOVar5;
          goto LAB_00171605;
        }
      }
      else {
        pcVar2 = std::
                 variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                          *)(in_RDI + 0x18),pcVar4,__c_02);
        if (pcVar2 == (char *)0x1) {
          pEVar6 = std::
                   get<optimization::common_expr_del::ExtraNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x171399);
          in_stack_ffffffffffffff8c = *pEVar6;
          pEVar6 = std::
                   get<optimization::common_expr_del::ExtraNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x1713b0);
          iVar8 = extraout_EDX_00;
          if (in_stack_ffffffffffffff8c != *pEVar6) {
            pEVar6 = std::
                     get<optimization::common_expr_del::ExtraNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                               ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                 *)0x1713c9);
            EVar11 = *pEVar6;
            pEVar6 = std::
                     get<optimization::common_expr_del::ExtraNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                               ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                 *)0x1713e0);
            local_1 = (int)EVar11 < (int)*pEVar6;
            goto LAB_00171605;
          }
        }
        else {
          pIVar7 = std::
                   get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x17140a);
          in_stack_ffffffffffffff84 = *pIVar7;
          pIVar7 = std::
                   get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                             ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                               *)0x171421);
          iVar8 = extraout_EDX_01;
          if (in_stack_ffffffffffffff84 != *pIVar7) {
            pIVar7 = std::
                     get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                               ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                 *)0x17143a);
            IVar10 = *pIVar7;
            pIVar7 = std::
                     get<optimization::common_expr_del::InNormOp,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                               ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                 *)0x171451);
            local_1 = (int)IVar10 < (int)*pIVar7;
            goto LAB_00171605;
          }
        }
      }
      pcVar2 = std::
               variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
               ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                        *)(in_RDI + 0x18),pcVar4,iVar8);
      uVar9 = true;
      iVar8 = __c_03;
      if (pcVar2 != (char *)0x0) {
        pcVar2 = std::
                 variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                 ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                          *)(in_RDI + 0x18),pcVar4,__c_03);
        uVar9 = pcVar2 == (char *)0x1;
        iVar8 = extraout_EDX_02;
      }
      if ((bool)uVar9 == false) {
        __assert_fail("op.index() == 0 || op.index() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/common_expression_delete.hpp"
                      ,0x9f,
                      "bool optimization::common_expr_del::Node::operator<(const Node &) const");
      }
      pcVar4 = std::
               variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
               ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                        *)(in_RDI + 0x18),pcVar4,iVar8);
      if ((pcVar4 == (char *)0x0) &&
         ((pOVar5 = std::
                    get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                *)0x1714f6), *pOVar5 == Add ||
          (pOVar5 = std::
                    get<mir::inst::Op,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              ((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                                *)0x171509), *pOVar5 == Mul)))) {
        bVar1 = std::operator==((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (bVar1) {
          local_1 = 0;
          goto LAB_00171605;
        }
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::begin((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        __first._M_current._4_4_ = in_stack_ffffffffffffff84;
        __first._M_current._0_4_ = in_stack_ffffffffffffff80;
        __last._M_current._7_1_ = uVar9;
        __last._M_current._0_7_ = in_stack_ffffffffffffff78;
        std::
        reverse<__gnu_cxx::__normal_iterator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>*,std::vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>>>
                  (__first,__last);
        bVar1 = std::operator==((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (bVar1) {
          local_1 = 0;
        }
        std::
        vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (bVar1) goto LAB_00171605;
      }
      local_1 = std::operator<((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      pcVar2 = std::
               variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
               ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                        *)(in_RDI + 0x18),pcVar4,__c_00);
      pcVar4 = std::
               variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
               ::index((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                        *)(in_RSI + 0x18),pcVar4,__c_01);
      local_1 = pcVar2 < pcVar4;
    }
  }
  else {
    local_1 = (*(byte *)(in_RDI + 0xf8) & 1) < (in_RSI[0xf8] & 1U);
  }
LAB_00171605:
  return (bool)(local_1 & 1);
}

Assistant:

bool operator<(const Node& other) const {
    if (is_leaf != other.is_leaf) {
      return is_leaf < other.is_leaf;
    }
    if (op.index() != other.op.index()) {
      return op.index() < other.op.index();
    }
    // same kind op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) != std::get<NormOp>(other.op)) {
        return std::get<NormOp>(op) < std::get<NormOp>(other.op);
      }
    } else if (op.index() == 1) {
      if (std::get<ExtraNormOp>(op) != std::get<ExtraNormOp>(other.op)) {
        return std::get<ExtraNormOp>(op) < std::get<ExtraNormOp>(other.op);
      }
    } else {
      if (std::get<InNormOp>(op) != std::get<InNormOp>(other.op)) {
        return std::get<InNormOp>(op) < std::get<InNormOp>(other.op);
      }
    }
    assert(op.index() == 0 ||
           op.index() == 1);  // only Norm op is allowed to reuse the node
    // same op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) == NormOp::Add ||
          std::get<NormOp>(op) == NormOp::Mul) {
        if (operands == other.operands) {
          return false;
        }
        std::vector<Operand> reverse_operands(operands);
        std::reverse(reverse_operands.begin(), reverse_operands.end());
        if (reverse_operands == other.operands) {
          return false;
        }
      }
    }

    return operands < other.operands;
  }